

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::detail::
eval_function<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
          (detail *this,Dispatch_Engine *t_ss,
          AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *t_node,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *t_param_names,Function_Params *t_vals,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
          *t_locals,bool has_this_capture)

{
  ulong uVar1;
  type *t_name;
  bool bVar2;
  Boxed_Value *pBVar3;
  size_type sVar4;
  const_reference pvVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar6;
  Return_Value *rv;
  Boxed_Value local_128;
  ulong local_118;
  size_t i;
  type *local_100;
  type *value;
  type *name;
  _Self local_e8;
  const_iterator __end4;
  const_iterator __begin4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  *__range4;
  allocator<char> local_a9;
  string local_a8;
  Stack_Push_Pop local_88;
  Stack_Push_Pop tpp;
  Boxed_Value *thisobj;
  Dispatch_State state;
  bool has_this_capture_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  *t_locals_local;
  Function_Params *t_vals_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *t_param_names_local;
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *t_node_local;
  Dispatch_Engine *t_ss_local;
  
  state.m_conversions.m_saves._M_data._7_1_ = has_this_capture;
  chaiscript::detail::Dispatch_State::Dispatch_State((Dispatch_State *)&thisobj,t_ss);
  tpp.m_ds = (Dispatch_State *)t_ss;
  pBVar3 = eval_function<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
           anon_class_24_3_184ec0ec::operator()((anon_class_24_3_184ec0ec *)&tpp);
  Stack_Push_Pop::Stack_Push_Pop(&local_88,(Dispatch_State *)&thisobj);
  if ((pBVar3 != (Boxed_Value *)0x0) && ((state.m_conversions.m_saves._M_data._7_1_ & 1) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"this",&local_a9);
    Boxed_Value::Boxed_Value((Boxed_Value *)&__range4,pBVar3);
    chaiscript::detail::Dispatch_State::add_object
              ((Dispatch_State *)&thisobj,&local_a8,(Boxed_Value *)&__range4);
    Boxed_Value::~Boxed_Value((Boxed_Value *)&__range4);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
  }
  if (t_locals !=
      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
       *)0x0) {
    __end4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
             ::begin(t_locals);
    local_e8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
         ::end(t_locals);
    while (bVar2 = std::operator==(&__end4,&local_e8), ((bVar2 ^ 0xffU) & 1) != 0) {
      name = &std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>
              ::operator*(&__end4)->first;
      value = (type *)std::get<0ul,std::__cxx11::string_const,chaiscript::Boxed_Value>
                                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
                                  *)name);
      local_100 = std::get<1ul,std::__cxx11::string_const,chaiscript::Boxed_Value>
                            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
                              *)name);
      t_name = value;
      Boxed_Value::Boxed_Value((Boxed_Value *)&i,local_100);
      chaiscript::detail::Dispatch_State::add_object
                ((Dispatch_State *)&thisobj,(string *)t_name,(Boxed_Value *)&i);
      Boxed_Value::~Boxed_Value((Boxed_Value *)&i);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>
      ::operator++(&__end4);
    }
  }
  for (local_118 = 0; uVar1 = local_118,
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(t_param_names), uVar1 < sVar4; local_118 = local_118 + 1) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](t_param_names,local_118);
    bVar2 = std::operator==(pvVar5,"this");
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](t_param_names,local_118);
      pBVar3 = Function_Params::operator[](t_vals,local_118);
      Boxed_Value::Boxed_Value(&local_128,pBVar3);
      chaiscript::detail::Dispatch_State::add_object((Dispatch_State *)&thisobj,pvVar5,&local_128);
      Boxed_Value::~Boxed_Value(&local_128);
    }
  }
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
            ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)this,
             (Dispatch_State *)t_node);
  Stack_Push_Pop::~Stack_Push_Pop(&local_88);
  BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_function(chaiscript::detail::Dispatch_Engine &t_ss,
                                const AST_Node_Impl<T> &t_node,
                                const std::vector<std::string> &t_param_names,
                                const Function_Params &t_vals,
                                const std::map<std::string, Boxed_Value> *t_locals = nullptr,
                                bool has_this_capture = false) {
        chaiscript::detail::Dispatch_State state(t_ss);

        const Boxed_Value *thisobj = [&]() -> const Boxed_Value * {
          if (auto &stack = t_ss.get_stack_data(state.stack_holder()).back(); !stack.empty() && stack.back().first == "__this") {
            return &stack.back().second;
          } else if (!t_vals.empty()) {
            return &t_vals[0];
          } else {
            return nullptr;
          }
        }();

        chaiscript::eval::detail::Stack_Push_Pop tpp(state);
        if (thisobj && !has_this_capture) {
          state.add_object("this", *thisobj);
        }

        if (t_locals) {
          for (const auto &[name, value] : *t_locals) {
            state.add_object(name, value);
          }
        }

        for (size_t i = 0; i < t_param_names.size(); ++i) {
          if (t_param_names[i] != "this") {
            state.add_object(t_param_names[i], t_vals[i]);
          }
        }

        try {
          return t_node.eval(state);
        } catch (detail::Return_Value &rv) {
          return std::move(rv.retval);
        }
      }